

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O2

void __thiscall
wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
          (AbstractChildIterator<wasm::ChildIterator> *this,Expression *parent)

{
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  StringConcat *pSVar5;
  StringEq *pSVar6;
  ArrayGet *pAVar7;
  ArraySet *pAVar8;
  StructCmpxchg *pSVar9;
  ArrayInitData *pAVar10;
  StringWTF16Get *pSVar11;
  ArrayNewData *pAVar12;
  SIMDExtract *pSVar13;
  MemoryFill *pMVar14;
  RefI31 *pRVar15;
  AtomicCmpxchg *pAVar16;
  RefIsNull *pRVar17;
  StructSet *pSVar18;
  ContBind *pCVar19;
  ContNew *pCVar20;
  MemoryCopy *pMVar21;
  TableGet *pTVar22;
  CallRef *pCVar23;
  SIMDReplace *pSVar24;
  Select *pSVar25;
  Drop *pDVar26;
  TableGrow *pTVar27;
  StringEncode *pSVar28;
  Unary *pUVar29;
  SIMDShuffle *pSVar30;
  StringMeasure *pSVar31;
  Call *pCVar32;
  ArrayInitElem *pAVar33;
  AtomicNotify *pAVar34;
  TupleExtract *pTVar35;
  TryTable *pTVar36;
  ArrayFill *pAVar37;
  TableInit *pTVar38;
  CallIndirect *pCVar39;
  Load *pLVar40;
  Try *pTVar41;
  LocalSet *pLVar42;
  Break *pBVar43;
  If *pIVar44;
  RefTest *pRVar45;
  AtomicWait *pAVar46;
  ArrayNewElem *pAVar47;
  Switch *pSVar48;
  ThrowRef *pTVar49;
  ArrayNew *pAVar50;
  MemoryGrow *pMVar51;
  Return *pRVar52;
  StructRMW *pSVar53;
  I31Get *pIVar54;
  GlobalSet *pGVar55;
  RefCast *pRVar56;
  StructNew *pSVar57;
  BrOn *pBVar58;
  Loop *pLVar59;
  SIMDTernary *pSVar60;
  Store *pSVar61;
  Binary *pBVar62;
  ArrayLen *pAVar63;
  Suspend *pSVar64;
  StructGet *pSVar65;
  AtomicRMW *pAVar66;
  SIMDLoad *pSVar67;
  TableSet *pTVar68;
  TableFill *pTVar69;
  SIMDShift *pSVar70;
  SIMDLoadStoreLane *pSVar71;
  RefAs *pRVar72;
  MemoryInit *pMVar73;
  TableCopy *pTVar74;
  Throw *pTVar75;
  RefEq *pRVar76;
  StringSliceWTF *pSVar77;
  ResumeThrow *pRVar78;
  ArrayCopy *pAVar79;
  TupleMake *pTVar80;
  StringNew *pSVar81;
  ArrayNewFixed *pAVar82;
  ulong uVar83;
  
  (this->children).usedFixed = 0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(parent->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pBVar1 = Expression::cast<wasm::Block>(parent);
    uVar83 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case IfId:
    pIVar44 = Expression::cast<wasm::If>(parent);
    if (pIVar44->ifFalse != (Expression *)0x0) {
      addChild(this,parent,&pIVar44->ifFalse);
    }
    addChild(this,parent,&pIVar44->ifTrue);
    addChild(this,parent,&pIVar44->condition);
    break;
  case LoopId:
    pLVar59 = Expression::cast<wasm::Loop>(parent);
    addChild(this,parent,&pLVar59->body);
    break;
  case BreakId:
    pBVar43 = Expression::cast<wasm::Break>(parent);
    if (pBVar43->condition != (Expression *)0x0) {
      addChild(this,parent,&pBVar43->condition);
    }
    if (pBVar43->value != (Expression *)0x0) {
      addChild(this,parent,&pBVar43->value);
    }
    break;
  case SwitchId:
    pSVar48 = Expression::cast<wasm::Switch>(parent);
    addChild(this,parent,&pSVar48->condition);
    if (pSVar48->value != (Expression *)0x0) {
      addChild(this,parent,&pSVar48->value);
    }
    break;
  case CallId:
    pCVar32 = Expression::cast<wasm::Call>(parent);
    uVar83 = (ulong)(uint)(pCVar32->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar32->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case CallIndirectId:
    pCVar39 = Expression::cast<wasm::CallIndirect>(parent);
    addChild(this,parent,&pCVar39->target);
    uVar83 = (ulong)(uint)(pCVar39->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar39->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(parent);
    return;
  case LocalSetId:
    pLVar42 = Expression::cast<wasm::LocalSet>(parent);
    addChild(this,parent,&pLVar42->value);
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(parent);
    return;
  case GlobalSetId:
    pGVar55 = Expression::cast<wasm::GlobalSet>(parent);
    addChild(this,parent,&pGVar55->value);
    break;
  case LoadId:
    pLVar40 = Expression::cast<wasm::Load>(parent);
    addChild(this,parent,&pLVar40->ptr);
    break;
  case StoreId:
    pSVar61 = Expression::cast<wasm::Store>(parent);
    addChild(this,parent,&pSVar61->value);
    addChild(this,parent,&pSVar61->ptr);
    break;
  case ConstId:
    Expression::cast<wasm::Const>(parent);
    return;
  case UnaryId:
    pUVar29 = Expression::cast<wasm::Unary>(parent);
    addChild(this,parent,&pUVar29->value);
    break;
  case BinaryId:
    pBVar62 = Expression::cast<wasm::Binary>(parent);
    addChild(this,parent,&pBVar62->right);
    addChild(this,parent,&pBVar62->left);
    break;
  case SelectId:
    pSVar25 = Expression::cast<wasm::Select>(parent);
    addChild(this,parent,&pSVar25->condition);
    addChild(this,parent,&pSVar25->ifFalse);
    addChild(this,parent,&pSVar25->ifTrue);
    break;
  case DropId:
    pDVar26 = Expression::cast<wasm::Drop>(parent);
    addChild(this,parent,&pDVar26->value);
    break;
  case ReturnId:
    pRVar52 = Expression::cast<wasm::Return>(parent);
    if (pRVar52->value != (Expression *)0x0) {
      addChild(this,parent,&pRVar52->value);
    }
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(parent);
    return;
  case MemoryGrowId:
    pMVar51 = Expression::cast<wasm::MemoryGrow>(parent);
    addChild(this,parent,&pMVar51->delta);
    break;
  case NopId:
    Expression::cast<wasm::Nop>(parent);
    return;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(parent);
    return;
  case AtomicRMWId:
    pAVar66 = Expression::cast<wasm::AtomicRMW>(parent);
    addChild(this,parent,&pAVar66->value);
    addChild(this,parent,&pAVar66->ptr);
    break;
  case AtomicCmpxchgId:
    pAVar16 = Expression::cast<wasm::AtomicCmpxchg>(parent);
    addChild(this,parent,&pAVar16->replacement);
    addChild(this,parent,&pAVar16->expected);
    addChild(this,parent,&pAVar16->ptr);
    break;
  case AtomicWaitId:
    pAVar46 = Expression::cast<wasm::AtomicWait>(parent);
    addChild(this,parent,&pAVar46->timeout);
    addChild(this,parent,&pAVar46->expected);
    addChild(this,parent,&pAVar46->ptr);
    break;
  case AtomicNotifyId:
    pAVar34 = Expression::cast<wasm::AtomicNotify>(parent);
    addChild(this,parent,&pAVar34->notifyCount);
    addChild(this,parent,&pAVar34->ptr);
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(parent);
    return;
  case SIMDExtractId:
    pSVar13 = Expression::cast<wasm::SIMDExtract>(parent);
    addChild(this,parent,&pSVar13->vec);
    break;
  case SIMDReplaceId:
    pSVar24 = Expression::cast<wasm::SIMDReplace>(parent);
    addChild(this,parent,&pSVar24->value);
    addChild(this,parent,&pSVar24->vec);
    break;
  case SIMDShuffleId:
    pSVar30 = Expression::cast<wasm::SIMDShuffle>(parent);
    addChild(this,parent,&pSVar30->right);
    addChild(this,parent,&pSVar30->left);
    break;
  case SIMDTernaryId:
    pSVar60 = Expression::cast<wasm::SIMDTernary>(parent);
    addChild(this,parent,&pSVar60->c);
    addChild(this,parent,&pSVar60->b);
    addChild(this,parent,&pSVar60->a);
    break;
  case SIMDShiftId:
    pSVar70 = Expression::cast<wasm::SIMDShift>(parent);
    addChild(this,parent,&pSVar70->shift);
    addChild(this,parent,&pSVar70->vec);
    break;
  case SIMDLoadId:
    pSVar67 = Expression::cast<wasm::SIMDLoad>(parent);
    addChild(this,parent,&pSVar67->ptr);
    break;
  case SIMDLoadStoreLaneId:
    pSVar71 = Expression::cast<wasm::SIMDLoadStoreLane>(parent);
    addChild(this,parent,&pSVar71->vec);
    addChild(this,parent,&pSVar71->ptr);
    break;
  case MemoryInitId:
    pMVar73 = Expression::cast<wasm::MemoryInit>(parent);
    addChild(this,parent,&pMVar73->size);
    addChild(this,parent,&pMVar73->offset);
    addChild(this,parent,&pMVar73->dest);
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(parent);
    return;
  case MemoryCopyId:
    pMVar21 = Expression::cast<wasm::MemoryCopy>(parent);
    addChild(this,parent,&pMVar21->size);
    addChild(this,parent,&pMVar21->source);
    addChild(this,parent,&pMVar21->dest);
    break;
  case MemoryFillId:
    pMVar14 = Expression::cast<wasm::MemoryFill>(parent);
    addChild(this,parent,&pMVar14->size);
    addChild(this,parent,&pMVar14->value);
    addChild(this,parent,&pMVar14->dest);
    break;
  case PopId:
    Expression::cast<wasm::Pop>(parent);
    return;
  case RefNullId:
    Expression::cast<wasm::RefNull>(parent);
    return;
  case RefIsNullId:
    pRVar17 = Expression::cast<wasm::RefIsNull>(parent);
    addChild(this,parent,&pRVar17->value);
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(parent);
    return;
  case RefEqId:
    pRVar76 = Expression::cast<wasm::RefEq>(parent);
    addChild(this,parent,&pRVar76->right);
    addChild(this,parent,&pRVar76->left);
    break;
  case TableGetId:
    pTVar22 = Expression::cast<wasm::TableGet>(parent);
    addChild(this,parent,&pTVar22->index);
    break;
  case TableSetId:
    pTVar68 = Expression::cast<wasm::TableSet>(parent);
    addChild(this,parent,&pTVar68->value);
    addChild(this,parent,&pTVar68->index);
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(parent);
    return;
  case TableGrowId:
    pTVar27 = Expression::cast<wasm::TableGrow>(parent);
    addChild(this,parent,&pTVar27->delta);
    addChild(this,parent,&pTVar27->value);
    break;
  case TableFillId:
    pTVar69 = Expression::cast<wasm::TableFill>(parent);
    addChild(this,parent,&pTVar69->size);
    addChild(this,parent,&pTVar69->value);
    addChild(this,parent,&pTVar69->dest);
    break;
  case TableCopyId:
    pTVar74 = Expression::cast<wasm::TableCopy>(parent);
    addChild(this,parent,&pTVar74->size);
    addChild(this,parent,&pTVar74->source);
    addChild(this,parent,&pTVar74->dest);
    break;
  case TableInitId:
    pTVar38 = Expression::cast<wasm::TableInit>(parent);
    addChild(this,parent,&pTVar38->size);
    addChild(this,parent,&pTVar38->offset);
    addChild(this,parent,&pTVar38->dest);
    break;
  case TryId:
    pTVar41 = Expression::cast<wasm::Try>(parent);
    uVar83 = (ulong)(uint)(pTVar41->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar41->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    addChild(this,parent,&pTVar41->body);
    break;
  case TryTableId:
    pTVar36 = Expression::cast<wasm::TryTable>(parent);
    addChild(this,parent,&pTVar36->body);
    break;
  case ThrowId:
    pTVar75 = Expression::cast<wasm::Throw>(parent);
    uVar83 = (ulong)(uint)(pTVar75->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar75->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(parent);
    return;
  case ThrowRefId:
    pTVar49 = Expression::cast<wasm::ThrowRef>(parent);
    addChild(this,parent,&pTVar49->exnref);
    break;
  case TupleMakeId:
    pTVar80 = Expression::cast<wasm::TupleMake>(parent);
    uVar83 = (ulong)(uint)(pTVar80->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar80->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case TupleExtractId:
    pTVar35 = Expression::cast<wasm::TupleExtract>(parent);
    addChild(this,parent,&pTVar35->tuple);
    break;
  case RefI31Id:
    pRVar15 = Expression::cast<wasm::RefI31>(parent);
    addChild(this,parent,&pRVar15->value);
    break;
  case I31GetId:
    pIVar54 = Expression::cast<wasm::I31Get>(parent);
    addChild(this,parent,&pIVar54->i31);
    break;
  case CallRefId:
    pCVar23 = Expression::cast<wasm::CallRef>(parent);
    addChild(this,parent,&pCVar23->target);
    uVar83 = (ulong)(uint)(pCVar23->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar23->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case RefTestId:
    pRVar45 = Expression::cast<wasm::RefTest>(parent);
    addChild(this,parent,&pRVar45->ref);
    break;
  case RefCastId:
    pRVar56 = Expression::cast<wasm::RefCast>(parent);
    addChild(this,parent,&pRVar56->ref);
    break;
  case BrOnId:
    pBVar58 = Expression::cast<wasm::BrOn>(parent);
    addChild(this,parent,&pBVar58->ref);
    break;
  case StructNewId:
    pSVar57 = Expression::cast<wasm::StructNew>(parent);
    uVar83 = (ulong)(uint)(pSVar57->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar57->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case StructGetId:
    pSVar65 = Expression::cast<wasm::StructGet>(parent);
    addChild(this,parent,&pSVar65->ref);
    break;
  case StructSetId:
    pSVar18 = Expression::cast<wasm::StructSet>(parent);
    addChild(this,parent,&pSVar18->value);
    addChild(this,parent,&pSVar18->ref);
    break;
  case StructRMWId:
    pSVar53 = Expression::cast<wasm::StructRMW>(parent);
    addChild(this,parent,&pSVar53->value);
    addChild(this,parent,&pSVar53->ref);
    break;
  case StructCmpxchgId:
    pSVar9 = Expression::cast<wasm::StructCmpxchg>(parent);
    addChild(this,parent,&pSVar9->replacement);
    addChild(this,parent,&pSVar9->expected);
    addChild(this,parent,&pSVar9->ref);
    break;
  case ArrayNewId:
    pAVar50 = Expression::cast<wasm::ArrayNew>(parent);
    addChild(this,parent,&pAVar50->size);
    if (pAVar50->init != (Expression *)0x0) {
      addChild(this,parent,&pAVar50->init);
    }
    break;
  case ArrayNewDataId:
    pAVar12 = Expression::cast<wasm::ArrayNewData>(parent);
    addChild(this,parent,&pAVar12->size);
    addChild(this,parent,&pAVar12->offset);
    break;
  case ArrayNewElemId:
    pAVar47 = Expression::cast<wasm::ArrayNewElem>(parent);
    addChild(this,parent,&pAVar47->size);
    addChild(this,parent,&pAVar47->offset);
    break;
  case ArrayNewFixedId:
    pAVar82 = Expression::cast<wasm::ArrayNewFixed>(parent);
    uVar83 = (ulong)(uint)(pAVar82->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar82->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case ArrayGetId:
    pAVar7 = Expression::cast<wasm::ArrayGet>(parent);
    addChild(this,parent,&pAVar7->index);
    addChild(this,parent,&pAVar7->ref);
    break;
  case ArraySetId:
    pAVar8 = Expression::cast<wasm::ArraySet>(parent);
    addChild(this,parent,&pAVar8->value);
    addChild(this,parent,&pAVar8->index);
    addChild(this,parent,&pAVar8->ref);
    break;
  case ArrayLenId:
    pAVar63 = Expression::cast<wasm::ArrayLen>(parent);
    addChild(this,parent,&pAVar63->ref);
    break;
  case ArrayCopyId:
    pAVar79 = Expression::cast<wasm::ArrayCopy>(parent);
    addChild(this,parent,&pAVar79->length);
    addChild(this,parent,&pAVar79->srcIndex);
    addChild(this,parent,&pAVar79->srcRef);
    addChild(this,parent,&pAVar79->destIndex);
    addChild(this,parent,&pAVar79->destRef);
    break;
  case ArrayFillId:
    pAVar37 = Expression::cast<wasm::ArrayFill>(parent);
    addChild(this,parent,&pAVar37->size);
    addChild(this,parent,&pAVar37->value);
    addChild(this,parent,&pAVar37->index);
    addChild(this,parent,&pAVar37->ref);
    break;
  case ArrayInitDataId:
    pAVar10 = Expression::cast<wasm::ArrayInitData>(parent);
    addChild(this,parent,&pAVar10->size);
    addChild(this,parent,&pAVar10->offset);
    addChild(this,parent,&pAVar10->index);
    addChild(this,parent,&pAVar10->ref);
    break;
  case ArrayInitElemId:
    pAVar33 = Expression::cast<wasm::ArrayInitElem>(parent);
    addChild(this,parent,&pAVar33->size);
    addChild(this,parent,&pAVar33->offset);
    addChild(this,parent,&pAVar33->index);
    addChild(this,parent,&pAVar33->ref);
    break;
  case RefAsId:
    pRVar72 = Expression::cast<wasm::RefAs>(parent);
    addChild(this,parent,&pRVar72->value);
    break;
  case StringNewId:
    pSVar81 = Expression::cast<wasm::StringNew>(parent);
    if (pSVar81->end != (Expression *)0x0) {
      addChild(this,parent,&pSVar81->end);
    }
    if (pSVar81->start != (Expression *)0x0) {
      addChild(this,parent,&pSVar81->start);
    }
    addChild(this,parent,&pSVar81->ref);
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(parent);
    return;
  case StringMeasureId:
    pSVar31 = Expression::cast<wasm::StringMeasure>(parent);
    addChild(this,parent,&pSVar31->ref);
    break;
  case StringEncodeId:
    pSVar28 = Expression::cast<wasm::StringEncode>(parent);
    if (pSVar28->start != (Expression *)0x0) {
      addChild(this,parent,&pSVar28->start);
    }
    addChild(this,parent,&pSVar28->array);
    addChild(this,parent,&pSVar28->str);
    break;
  case StringConcatId:
    pSVar5 = Expression::cast<wasm::StringConcat>(parent);
    addChild(this,parent,&pSVar5->right);
    addChild(this,parent,&pSVar5->left);
    break;
  case StringEqId:
    pSVar6 = Expression::cast<wasm::StringEq>(parent);
    addChild(this,parent,&pSVar6->right);
    addChild(this,parent,&pSVar6->left);
    break;
  case StringWTF16GetId:
    pSVar11 = Expression::cast<wasm::StringWTF16Get>(parent);
    addChild(this,parent,&pSVar11->pos);
    addChild(this,parent,&pSVar11->ref);
    break;
  case StringSliceWTFId:
    pSVar77 = Expression::cast<wasm::StringSliceWTF>(parent);
    addChild(this,parent,&pSVar77->end);
    addChild(this,parent,&pSVar77->start);
    addChild(this,parent,&pSVar77->ref);
    break;
  case ContNewId:
    pCVar20 = Expression::cast<wasm::ContNew>(parent);
    addChild(this,parent,&pCVar20->func);
    break;
  case ContBindId:
    pCVar19 = Expression::cast<wasm::ContBind>(parent);
    addChild(this,parent,&pCVar19->cont);
    uVar83 = (ulong)(uint)(pCVar19->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar19->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case SuspendId:
    pSVar64 = Expression::cast<wasm::Suspend>(parent);
    uVar83 = (ulong)(uint)(pSVar64->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar64->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case ResumeId:
    pRVar2 = Expression::cast<wasm::Resume>(parent);
    addChild(this,parent,&pRVar2->cont);
    uVar83 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case ResumeThrowId:
    pRVar78 = Expression::cast<wasm::ResumeThrow>(parent);
    addChild(this,parent,&pRVar78->cont);
    uVar83 = (ulong)(uint)(pRVar78->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar78->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
    break;
  case StackSwitchId:
    pSVar3 = Expression::cast<wasm::StackSwitch>(parent);
    addChild(this,parent,&pSVar3->cont);
    uVar83 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar83) {
      uVar83 = uVar83 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar83);
      addChild(this,parent,ppEVar4);
    }
  }
  return;
}

Assistant:

AbstractChildIterator(Expression* parent) {
    auto* self = (Specific*)this;

#define DELEGATE_ID parent->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = parent->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field) self->addChild(parent, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  if (cast->field) {                                                           \
    self->addChild(parent, &cast->field);                                      \
  }

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }